

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O3

void testProcrustesWithMatrix<double>(M44d *m)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  double dVar6;
  Rand48 random;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> toPoints;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> fromPoints;
  ushort local_14e [3];
  void *local_148;
  void *pvStack_140;
  long local_138;
  void *local_128;
  void *pvStack_120;
  long local_118;
  undefined1 local_108 [16];
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing Procrustes algorithm with arbitrary matrix: \n",0x35);
  Imath_3_2::operator<<((ostream *)&std::cout,m);
  local_118 = 0;
  local_128 = (void *)0x0;
  pvStack_120 = (void *)0x0;
  local_138 = 0;
  local_148 = (void *)0x0;
  pvStack_140 = (void *)0x0;
  local_14e[0] = 0x7c67;
  local_14e[1] = 0x1005;
  local_14e[2] = 0x7c67;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   numPoints: ",0xe);
  lVar3 = 1;
  do {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    std::ostream::flush();
    if (pvStack_120 != local_128) {
      pvStack_120 = local_128;
    }
    lVar4 = lVar3;
    if (pvStack_140 != local_148) {
      pvStack_140 = local_148;
    }
    do {
      local_a8 = (double)Imath_3_2::erand48(local_14e);
      local_b8 = (double)Imath_3_2::erand48(local_14e);
      local_f8 = (double)Imath_3_2::erand48(local_14e);
      local_88 = m->x[0][0];
      dStack_80 = m->x[0][1];
      local_98 = m->x[1][0];
      dStack_90 = m->x[1][1];
      local_68 = m->x[2][0];
      dStack_60 = m->x[2][1];
      local_58 = m->x[3][0];
      dStack_50 = m->x[3][1];
      local_e0 = m->x[0][2];
      local_f0 = m->x[1][2];
      local_e8 = m->x[2][2];
      local_c0 = m->x[3][2];
      local_c8 = m->x[0][3];
      local_d8 = m->x[1][3];
      local_d0 = m->x[2][3];
      local_78 = m->x[3][3];
      uStack_70 = 0;
      local_108._8_8_ = local_b8;
      local_108._0_8_ = local_a8;
      local_48 = local_f8;
      std::vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>>::
      emplace_back<Imath_3_2::Vec3<double>>
                ((vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>> *)
                 &local_128,(Vec3<double> *)local_108);
      dVar6 = local_78 + local_d0 * local_48 + local_c8 * local_a8 + local_d8 * local_b8;
      local_f8 = (local_c0 + local_e8 * local_48 + local_e0 * local_a8 + local_f0 * local_b8) /
                 dVar6;
      auVar5._0_8_ = local_58 + local_48 * local_68 + local_a8 * local_88 + local_b8 * local_98;
      auVar5._8_8_ = dStack_50 + local_48 * dStack_60 + local_a8 * dStack_80 + local_b8 * dStack_90;
      auVar1._8_8_ = dVar6;
      auVar1._0_8_ = dVar6;
      local_108 = divpd(auVar5,auVar1);
      std::vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>>::
      emplace_back<Imath_3_2::Vec3<double>>
                ((vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>> *)
                 &local_148,(Vec3<double> *)local_108);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    verifyProcrustes<double>
              ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)
               &local_128,
               (vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)
               &local_148);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK\n",3);
  if (local_148 != (void *)0x0) {
    operator_delete(local_148,local_138 - (long)local_148);
  }
  if (local_128 != (void *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  return;
}

Assistant:

void
testProcrustesWithMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing Procrustes algorithm with arbitrary matrix: \n" << m;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>> fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>> toPoints;

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    std::cout << "   numPoints: ";
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        std::cout << numPoints << " " << std::flush;
        fromPoints.clear ();
        toPoints.clear ();
        for (size_t i = 0; i < numPoints; ++i)
        {
            const IMATH_INTERNAL_NAMESPACE::V3d fromPt (
                random.nextf (), random.nextf (), random.nextf ());
            const IMATH_INTERNAL_NAMESPACE::V3d toPt = fromPt * m;
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (fromPt));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (toPt));
        }
        verifyProcrustes (fromPoints, toPoints);
    }
    std::cout << "OK\n";
}